

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slicing.h
# Opt level: O0

void dg::WalkAndMark<dg::LLVMNode>::markSlice(LLVMNode *n,WalkData *data)

{
  bool bVar1;
  LLVMNode *pLVar2;
  reference ppBVar3;
  DependenceGraph<dg::LLVMNode> *this;
  LLVMNode *pLVar4;
  uint32_t *in_RSI;
  LLVMNode *in_RDI;
  pair<std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*>,_bool> pVar5;
  LLVMNode *entry;
  DependenceGraph<dg::LLVMNode> *dg;
  LLVMNode *cdnd;
  iterator __end0_1;
  iterator __begin0_1;
  list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_> *__range6;
  BBlock<dg::LLVMNode> *CD;
  const_iterator __end0;
  const_iterator __begin0;
  BBlockContainerT *__range5;
  control_iterator et;
  control_iterator it;
  BBlock<dg::LLVMNode> *B;
  uint32_t slice_id;
  BBlock<dg::LLVMNode> *in_stack_ffffffffffffff58;
  _Rb_tree_const_iterator<dg::LLVMNode_*> *in_stack_ffffffffffffff60;
  LLVMNode *in_stack_ffffffffffffff68;
  NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_> *in_stack_ffffffffffffff70;
  value_type *in_stack_ffffffffffffff78;
  set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
  *in_stack_ffffffffffffff80;
  _Self local_78;
  _Self local_70;
  list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_> *local_68;
  BBlock<dg::LLVMNode> *local_60;
  _Self local_58;
  _Self local_50;
  BBlockContainerT *local_48;
  _Self local_40;
  _Self local_38;
  _Base_ptr local_30;
  undefined1 local_28;
  BBlock<dg::LLVMNode> *local_20;
  uint32_t local_14;
  uint32_t *local_10;
  LLVMNode *local_8;
  
  local_14 = *in_RSI;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::setSlice
            (&in_RDI->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>,local_14);
  local_20 = Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::getBBlock
                       (&local_8->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>);
  if (local_20 != (BBlock<dg::LLVMNode> *)0x0) {
    BBlock<dg::LLVMNode>::setSlice(local_20,(ulong)local_14);
    if (*(long *)(local_10 + 4) != 0) {
      pVar5 = std::
              set<dg::BBlock<dg::LLVMNode>_*,_std::less<dg::BBlock<dg::LLVMNode>_*>,_std::allocator<dg::BBlock<dg::LLVMNode>_*>_>
              ::insert(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      local_30 = (_Base_ptr)pVar5.first._M_node;
      local_28 = pVar5.second;
    }
    bVar1 = isForward(*(WalkAndMark<dg::LLVMNode> **)(local_10 + 2));
    if (bVar1) {
      local_38._M_node =
           (_Base_ptr)
           Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::control_begin
                     ((Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *)
                      in_stack_ffffffffffffff58);
      local_40._M_node =
           (_Base_ptr)
           Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::control_end
                     ((Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *)
                      in_stack_ffffffffffffff58);
      while (bVar1 = std::operator!=(&local_38,&local_40), bVar1) {
        in_stack_ffffffffffffff68 = *(LLVMNode **)(local_10 + 2);
        std::_Rb_tree_const_iterator<dg::LLVMNode_*>::operator*
                  ((_Rb_tree_const_iterator<dg::LLVMNode_*> *)0x1c46c8);
        legacy::NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>::enqueue
                  (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        std::_Rb_tree_const_iterator<dg::LLVMNode_*>::operator++(in_stack_ffffffffffffff60);
      }
      pLVar4 = local_8;
      pLVar2 = BBlock<dg::LLVMNode>::getLastNode(in_stack_ffffffffffffff58);
      if (pLVar4 == pLVar2) {
        local_48 = BBlock<dg::LLVMNode>::controlDependence(local_20);
        local_50._M_node =
             (_Base_ptr)
             DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>::begin
                       ((DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U> *)in_stack_ffffffffffffff58);
        local_58._M_node =
             (_Base_ptr)
             DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U>::end
                       ((DGContainer<dg::BBlock<dg::LLVMNode>_*,_4U> *)in_stack_ffffffffffffff58);
        while (bVar1 = std::operator!=(&local_50,&local_58), bVar1) {
          ppBVar3 = std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*>::operator*
                              ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*> *)0x1c475e);
          local_60 = *ppBVar3;
          local_68 = BBlock<dg::LLVMNode>::getNodes_abi_cxx11_(local_60);
          local_70._M_node =
               (_List_node_base *)
               std::__cxx11::list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>::begin
                         ((list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_> *)
                          in_stack_ffffffffffffff58);
          local_78._M_node =
               (_List_node_base *)
               std::__cxx11::list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>::end
                         ((list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_> *)
                          in_stack_ffffffffffffff58);
          while (bVar1 = std::operator!=(&local_70,&local_78), bVar1) {
            std::_List_iterator<dg::LLVMNode_*>::operator*
                      ((_List_iterator<dg::LLVMNode_*> *)0x1c47b2);
            legacy::NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>::enqueue
                      (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
            std::_List_iterator<dg::LLVMNode_*>::operator++(&local_70);
          }
          std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*>::operator++
                    ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>_*> *)pLVar4);
        }
      }
    }
  }
  this = (DependenceGraph<dg::LLVMNode> *)
         Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::getDG
                   (&local_8->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>);
  if (this != (DependenceGraph<dg::LLVMNode> *)0x0) {
    (*(this->super_DependenceGraphBase)._vptr_DependenceGraphBase[2])(this,(ulong)local_14);
    bVar1 = isForward(*(WalkAndMark<dg::LLVMNode> **)(local_10 + 2));
    if (!bVar1) {
      pLVar4 = DependenceGraph<dg::LLVMNode>::getEntry(this);
      legacy::NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_>::enqueue
                ((NodesWalk<dg::LLVMNode,_dg::ADT::QueueFIFO<dg::LLVMNode_*>_> *)pLVar4,
                 in_stack_ffffffffffffff68);
    }
  }
  return;
}

Assistant:

static void markSlice(NodeT *n, WalkData *data) {
        uint32_t slice_id = data->slice_id;
        n->setSlice(slice_id);

#ifdef ENABLE_CFG
        // when we marked a node, we need to mark even
        // the basic block - if there are basic blocks
        if (BBlock<NodeT> *B = n->getBBlock()) {
            B->setSlice(slice_id);
            if (data->markedBlocks) {
                data->markedBlocks->insert(B);
            }

            // if this node has CDs, enque them
            if (data->analysis->isForward()) {
                for (auto it = n->control_begin(), et = n->control_end();
                     it != et; ++it) {
                    data->analysis->enqueue(*it);
                }

                // if this node is a jump instruction,
                // add also nodes that control depend on this jump
                if (n == B->getLastNode()) {
                    for (BBlock<NodeT> *CD : B->controlDependence()) {
                        for (auto *cdnd : CD->getNodes()) {
                            data->analysis->enqueue(cdnd);
                        }
                    }
                }
            }
        }
#endif

        // the same with dependence graph, if we keep a node from
        // a dependence graph, we need to keep the dependence graph
        if (DependenceGraph<NodeT> *dg = n->getDG()) {
            dg->setSlice(slice_id);
            if (!data->analysis->isForward()) {
                // and keep also all call-sites of this func (they are
                // control dependent on the entry node)
                // This is correct but not so precise - fix it later.
                // Now I need the correctness...
                NodeT *entry = dg->getEntry();
                assert(entry && "No entry node in dg");
                data->analysis->enqueue(entry);
            }
        }
    }